

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3UniqueConstraint(Parse *pParse,int onError,Index *pIdx)

{
  Table *pTVar1;
  char *pcVar2;
  ulong uVar3;
  StrAccum errMsg;
  
  pTVar1 = pIdx->pTable;
  errMsg.db = pParse->db;
  errMsg.zText = (char *)0x0;
  errMsg.nAlloc = 0;
  errMsg.mxAlloc = 200;
  errMsg.nChar = 0;
  errMsg.accError = '\0';
  errMsg.printfFlags = '\0';
  if (pIdx->aColExpr == (ExprList *)0x0) {
    for (uVar3 = 0; uVar3 < pIdx->nKeyCol; uVar3 = uVar3 + 1) {
      pcVar2 = pTVar1->aCol[pIdx->aiColumn[uVar3]].zName;
      if (uVar3 != 0) {
        sqlite3_str_append(&errMsg,", ",2);
      }
      sqlite3_str_appendall(&errMsg,pTVar1->zName);
      sqlite3_str_append(&errMsg,".",1);
      sqlite3_str_appendall(&errMsg,pcVar2);
    }
  }
  else {
    sqlite3_str_appendf(&errMsg,"index \'%q\'",pIdx->zName);
  }
  pcVar2 = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint
            (pParse,(uint)((*(ushort *)&pIdx->field_0x63 & 3) != 2) * 0x200 + 0x613,onError,pcVar2,
             -7,'\x02');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UniqueConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Constraint type */
  Index *pIdx       /* The index that triggers the constraint */
){
  char *zErr;
  int j;
  StrAccum errMsg;
  Table *pTab = pIdx->pTable;

  sqlite3StrAccumInit(&errMsg, pParse->db, 0, 0, 200);
  if( pIdx->aColExpr ){
    sqlite3_str_appendf(&errMsg, "index '%q'", pIdx->zName);
  }else{
    for(j=0; j<pIdx->nKeyCol; j++){
      char *zCol;
      assert( pIdx->aiColumn[j]>=0 );
      zCol = pTab->aCol[pIdx->aiColumn[j]].zName;
      if( j ) sqlite3_str_append(&errMsg, ", ", 2);
      sqlite3_str_appendall(&errMsg, pTab->zName);
      sqlite3_str_append(&errMsg, ".", 1);
      sqlite3_str_appendall(&errMsg, zCol);
    }
  }
  zErr = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint(pParse, 
    IsPrimaryKeyIndex(pIdx) ? SQLITE_CONSTRAINT_PRIMARYKEY 
                            : SQLITE_CONSTRAINT_UNIQUE,
    onError, zErr, P4_DYNAMIC, P5_ConstraintUnique);
}